

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# List.hpp
# Opt level: O2

void __thiscall List<Variant>::~List(List<Variant> *this)

{
  Variant *this_00;
  ItemBlock *pIVar1;
  ItemBlock *pIVar2;
  Data *pDVar3;
  
  pDVar3 = (Data *)&this->_begin;
  while (this_00 = *(Variant **)pDVar3, (Item *)this_00 != &this->endItem) {
    Variant::clear(this_00);
    pDVar3 = &this_00[1]._data;
  }
  pIVar2 = this->blocks;
  while (pIVar2 != (ItemBlock *)0x0) {
    pIVar1 = pIVar2->next;
    operator_delete__(pIVar2);
    pIVar2 = pIVar1;
  }
  Variant::clear(&(this->endItem).value);
  return;
}

Assistant:

~List()
  {
    for(Item* i = _begin.item, * end = &endItem; i != end; i = i->next)
      i->~Item();
    for(ItemBlock* i = blocks, * next; i; i = next)
    {
      next = i->next;
      delete[] (char*)i;
    }
  }